

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

ArrayPtr<const_capnp::_::RawBrandedSchema::Binding> __thiscall
capnp::SchemaLoader::Impl::copyDeduped<capnp::_::RawBrandedSchema::Binding>
          (Impl *this,ArrayPtr<const_capnp::_::RawBrandedSchema::Binding> values)

{
  ArrayPtr<const_unsigned_char> *dupe;
  Binding *__dest;
  size_t sVar1;
  size_t amount;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Binding> AVar2;
  ArrayPtr<const_unsigned_char> bytes;
  ArrayPtr<const_unsigned_char> local_50;
  Binding *local_40;
  size_t local_38;
  
  sVar1 = values.size_;
  if (sVar1 == 0) {
    __dest = (Binding *)0x0;
    sVar1 = 0;
  }
  else {
    amount = sVar1 << 4;
    local_40 = values.ptr;
    local_38 = amount;
    kj::Table<kj::ArrayPtr<unsigned_char_const>,kj::HashIndex<kj::_::HashSetCallbacks>>::
    find<0ul,kj::ArrayPtr<unsigned_char_const>&>
              ((Table<kj::ArrayPtr<unsigned_char_const>,kj::HashIndex<kj::_::HashSetCallbacks>> *)
               &local_50,(ArrayPtr<const_unsigned_char> *)&this->dedupTable);
    if (local_50.ptr == (uchar *)0x0) {
      __dest = (Binding *)kj::Arena::allocateBytes(&this->arena,amount,8,false);
      memcpy(__dest,values.ptr,amount);
      local_50.ptr = (uchar *)__dest;
      local_50.size_ = amount;
      kj::Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>::insert
                (&(this->dedupTable).
                  super_Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>
                 ,&local_50);
    }
    else {
      __dest = *(Binding **)local_50.ptr;
    }
  }
  AVar2.size_ = sVar1;
  AVar2.ptr = __dest;
  return AVar2;
}

Assistant:

kj::ArrayPtr<const T> SchemaLoader::Impl::copyDeduped(kj::ArrayPtr<const T> values) {
  if (values.size() == 0) {
    return kj::arrayPtr(kj::implicitCast<const T*>(nullptr), 0);
  }

  auto bytes = values.asBytes();

  KJ_IF_SOME(dupe, dedupTable.find(bytes)) {
    return kj::arrayPtr(reinterpret_cast<const T*>(dupe.begin()), values.size());
  }

  // Need to make a new copy.
  auto copy = arena.allocateArray<T>(values.size());
  memcpy(copy.begin(), values.begin(), values.size() * sizeof(T));

  dedupTable.insert(copy.asBytes());

  return copy;
}